

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_lfsux(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *pTVar1;
  uint uVar2;
  TCGTemp *a1;
  TCGTemp *a2;
  uintptr_t o_4;
  TCGv_i64 arg;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_6;
  
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  if ((ctx->opcode & 0x1f0000) == 0) {
    gen_exception_err(ctx,0x60,0x21);
    return;
  }
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op2_ppc64(pTVar1,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar1),0x30);
    ctx->access_type = 0x30;
  }
  a2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a2 - (long)s);
  pTVar1 = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar2 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(pTVar1,INDEX_op_mov_i64,(TCGArg)((long)pTVar1 + (long)ret),
                          (TCGArg)(arg + (long)pTVar1));
      }
      goto LAB_00bab2b5;
    }
  }
  else {
    tcg_gen_op3_ppc64(pTVar1,INDEX_op_add_i64,(TCGArg)((long)pTVar1 + (long)ret),
                      (TCGArg)((long)&pTVar1->pool_cur + (long)cpu_gpr[uVar2]),
                      (TCGArg)(arg + (long)pTVar1));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00bab2b5;
  }
  tcg_gen_ext32u_i64_ppc64(pTVar1,ret,arg);
LAB_00bab2b5:
  gen_qemu_ld32fs(ctx,(TCGv_i64)((long)a1 - (long)s),ret);
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
  if (cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] != ret) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,
                      (TCGArg)(cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] + (long)s),
                      (TCGArg)a2);
  }
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s) + (long)s));
  return;
}

Assistant:

static void gen_lfdepx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    CHK_SV;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, PPC_TLB_EPID_LOAD, DEF_MEMOP(MO_Q));
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}